

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O2

bool loot_prog_shelf(OBJ_DATA *shelf,OBJ_DATA *obj,CHAR_DATA *ch)

{
  ROOM_INDEX_DATA *pRVar1;
  CHAR_DATA *ch_00;
  bool bVar2;
  short sVar3;
  CHAR_DATA **ppCVar4;
  
  pRVar1 = shelf->in_room;
  if (pRVar1 != (ROOM_INDEX_DATA *)0x0) {
    sVar3 = shelf->pIndexData->vnum;
    if (sVar3 == 0x8c3) {
      sVar3 = 0x8ad;
      if (pRVar1->vnum != 0x94b) {
        return true;
      }
    }
    else if (sVar3 == 0x8c2) {
      sVar3 = 0x8ac;
      if (pRVar1->vnum != 0x949) {
        return true;
      }
    }
    else {
      if (sVar3 != 0x8c1) {
        return true;
      }
      sVar3 = 0x8ae;
      if (pRVar1->vnum != 0x947) {
        return true;
      }
    }
    ppCVar4 = &pRVar1->people;
    while (ch_00 = *ppCVar4, ch_00 != (CHAR_DATA *)0x0) {
      bVar2 = is_npc(ch_00);
      if ((bVar2) && (sVar3 == ch_00->pIndexData->vnum)) {
        act("$n bars your access to $p, and you are unable to do that.",ch_00,shelf,ch,2);
        act("$N moves toward $p as though to get something from it, but $n blocks $m.",ch_00,shelf,
            ch,1);
        return false;
      }
      ppCVar4 = &ch_00->next_in_room;
    }
  }
  return true;
}

Assistant:

bool loot_prog_shelf(OBJ_DATA *shelf, OBJ_DATA *obj, CHAR_DATA *ch)
{
	ROOM_INDEX_DATA *room;
	CHAR_DATA *mob;
	int mobvnum = 0;
	bool found= false;

	if ((room = shelf->in_room) == nullptr)
		return true;

	switch (shelf->pIndexData->vnum)
	{
		case 2241:
			if (room->vnum != 2375)
				return true;

			mobvnum = 2222;
			break;
		case 2242:
			if (room->vnum != 2377)
				return true;

			mobvnum = 2220;
			break;
		case 2243:
			if (room->vnum != 2379)
				return true;

			mobvnum = 2221;
			break;
		default:
			return true;
	}

	for (mob = room->people; mob; mob = mob->next_in_room)
	{
		if (!is_npc(mob))
			continue;

		if (mob->pIndexData->vnum == mobvnum)
		{
			found = true;
			break;
		}
	}

	if (!found)
		return true;

	act("$n bars your access to $p, and you are unable to do that.", mob, shelf, ch, TO_VICT);
	act("$N moves toward $p as though to get something from it, but $n blocks $m.", mob, shelf, ch, TO_NOTVICT);

	return false;
}